

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

void __thiscall
OpenMesh::IO::_PLYReader_::readCustomProperty
          (_PLYReader_ *this,istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName,
          ValueType _valueType)

{
  ostream *poVar1;
  
  switch(_valueType) {
  case ValueTypeINT8:
  case ValueTypeCHAR:
    assignCustomProperty<char>(_in,_bi,_vh,_propName);
    return;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"unsupported type");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  case ValueTypeINT16:
  case ValueTypeSHORT:
    assignCustomProperty<short>(_in,_bi,_vh,_propName);
    return;
  case ValueTypeUINT16:
  case ValueTypeUSHORT:
    assignCustomProperty<unsigned_short>(_in,_bi,_vh,_propName);
    return;
  case ValueTypeINT32:
  case ValueTypeINT:
    assignCustomProperty<int>(_in,_bi,_vh,_propName);
    return;
  case ValueTypeUINT32:
  case ValueTypeUINT:
    assignCustomProperty<unsigned_int>(_in,_bi,_vh,_propName);
    return;
  case ValueTypeFLOAT32:
  case ValueTypeFLOAT:
    assignCustomProperty<float>(_in,_bi,_vh,_propName);
    return;
  case ValueTypeFLOAT64:
  case ValueTypeDOUBLE:
    assignCustomProperty<double>(_in,_bi,_vh,_propName);
    return;
  }
}

Assistant:

void _PLYReader_::readCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName, const ValueType _valueType) const
{
  switch (_valueType)
  {
  case ValueTypeINT8:
  case ValueTypeCHAR:
      assignCustomProperty<char>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeINT16:
  case ValueTypeSHORT:
      assignCustomProperty<short>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeUINT16:
  case ValueTypeUSHORT:
      assignCustomProperty<unsigned short>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeINT32:
  case ValueTypeINT:
      assignCustomProperty<int>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeUINT32:
  case ValueTypeUINT:
      assignCustomProperty<unsigned int>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeFLOAT32:
  case ValueTypeFLOAT:
      assignCustomProperty<float>(_in,_bi,_vh,_propName);
      break;
  case ValueTypeFLOAT64:
  case ValueTypeDOUBLE:
      assignCustomProperty<double>(_in,_bi,_vh,_propName);
      break;
  default:
      std::cerr << "unsupported type" << std::endl;
      break;
  }
}